

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workerThread.cpp
# Opt level: O2

void __thiscall WorkerThread::workerFunction(WorkerThread *this)

{
  Task localTask;
  unique_lock<std::mutex> lock;
  packaged_task<void_()> local_58;
  unique_lock<std::mutex> local_40;
  
  local_58._M_state.
  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_58._M_state.
  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while (((this->stopMe)._M_base._M_i & 1U) == 0) {
    std::unique_lock<std::mutex>::unique_lock(&local_40,&this->taskMutex);
    while ((this->taskPresence == false && (((this->stopMe)._M_base._M_i & 1U) == 0))) {
      std::condition_variable::wait((unique_lock *)&this->taskCV);
    }
    std::packaged_task<void_()>::operator=(&local_58,&this->task);
    this->taskPresence = false;
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    if (((this->stopMe)._M_base._M_i & 1U) == 0) {
      std::packaged_task<void_()>::operator()(&local_58);
    }
  }
  std::packaged_task<void_()>::~packaged_task(&local_58);
  return;
}

Assistant:

void WorkerThread::workerFunction () {
	Task localTask;

	while (!stopMe) {
		{
			std::unique_lock<std::mutex> lock (taskMutex);
			taskCV.wait (lock, [&] {return taskPresence==true || stopMe;});
			localTask		= std::move(task);
			taskPresence	= false;
		}

		if (!stopMe) {
			// Executing submitted activity
			localTask ();
		}
	}
}